

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall toml::type_error::type_error(type_error *this,string *what_arg)

{
  string *what_arg_local;
  type_error *this_local;
  
  exception::exception(&this->super_exception);
  this->super_exception = (exception)&PTR__type_error_001a6d40;
  std::__cxx11::string::string((string *)&this->what_,(string *)what_arg);
  return;
}

Assistant:

explicit type_error(const std::string& what_arg) : what_(what_arg){}